

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_duck_schema.cpp
# Opt level: O1

unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true> __thiscall
duckdb::ArrowType::CreateListType
          (ArrowType *this,DBConfig *config,ArrowSchema *child,ArrowVariableSizeType size_type,
          bool view)

{
  pointer this_00;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true> child_type;
  LogicalType type;
  __uniq_ptr_impl<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_> local_80;
  undefined1 local_78 [24];
  shared_ptr<duckdb::ArrowType,_true> local_60;
  shared_ptr<duckdb::ArrowType,_true> local_50;
  LogicalType local_40;
  
  GetArrowLogicalType((ArrowType *)&local_80,config,child);
  this_00 = unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>::operator->
                      ((unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>
                        *)&local_80);
  GetDuckType((LogicalType *)local_78,this_00,false);
  LogicalType::LIST(&local_40,(LogicalType *)local_78);
  LogicalType::~LogicalType((LogicalType *)local_78);
  if (view) {
    ::std::__shared_ptr<duckdb::ArrowType,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<duckdb::ArrowType,std::default_delete<duckdb::ArrowType>,void>
              ((__shared_ptr<duckdb::ArrowType,(__gnu_cxx::_Lock_policy)2> *)&local_50,
               (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_> *)&local_80);
    ArrowListInfo::ListView((ArrowListInfo *)local_78,&local_50,size_type);
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._0_8_;
  }
  else {
    ::std::__shared_ptr<duckdb::ArrowType,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<duckdb::ArrowType,std::default_delete<duckdb::ArrowType>,void>
              ((__shared_ptr<duckdb::ArrowType,(__gnu_cxx::_Lock_policy)2> *)&local_60,
               (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_> *)&local_80);
    ArrowListInfo::List((ArrowListInfo *)local_78,&local_60,size_type);
    local_50.internal.super___shared_ptr<duckdb::ArrowType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = local_60.internal.super___shared_ptr<duckdb::ArrowType,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._0_8_;
  }
  local_78._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((__uniq_ptr_impl<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>)
      local_50.internal.super___shared_ptr<duckdb::ArrowType,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi !=
      (__uniq_ptr_impl<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.internal.super___shared_ptr<duckdb::ArrowType,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  peVar1 = (element_type *)operator_new(0x68);
  LogicalType::LogicalType((LogicalType *)local_78,&local_40);
  peVar1->arrow_to_duckdb = (cast_arrow_duck_t)0x0;
  peVar1->duckdb_to_arrow = (cast_duck_arrow_t)0x0;
  LogicalType::LogicalType(&peVar1->duckdb_type,(LogicalType *)local_78);
  *(undefined1 *)
   &(peVar1->internal_type).type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = 0;
  (peVar1->internal_type).id_ = INVALID;
  (peVar1->internal_type).physical_type_ = ~INVALID;
  *(undefined6 *)&(peVar1->internal_type).field_0x2 = 0;
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
  ((long)&(peVar1->internal_type).type_info_.internal + 8))->_M_pi = p_Var2;
  peVar1[1].arrow_to_duckdb = (cast_arrow_duck_t)&peVar1[1].duckdb_type;
  peVar1[1].duckdb_to_arrow = (cast_duck_arrow_t)0x0;
  peVar1[1].duckdb_type.id_ = INVALID;
  *(undefined1 *)
   &((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
    ((long)&peVar1[1].duckdb_type.type_info_.internal + 8))->_M_pi = 0;
  (this->extension_data).internal.
  super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  LogicalType::~LogicalType((LogicalType *)local_78);
  LogicalType::~LogicalType(&local_40);
  if ((_Tuple_impl<0UL,_duckdb::ArrowType_*,_std::default_delete<duckdb::ArrowType>_>)
      local_80._M_t.
      super__Tuple_impl<0UL,_duckdb::ArrowType_*,_std::default_delete<duckdb::ArrowType>_>.
      super__Head_base<0UL,_duckdb::ArrowType_*,_false>._M_head_impl != (ArrowType *)0x0) {
    ::std::default_delete<duckdb::ArrowType>::operator()
              ((default_delete<duckdb::ArrowType> *)&local_80,
               (ArrowType *)
               local_80._M_t.
               super__Tuple_impl<0UL,_duckdb::ArrowType_*,_std::default_delete<duckdb::ArrowType>_>.
               super__Head_base<0UL,_duckdb::ArrowType_*,_false>._M_head_impl);
  }
  return (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>)
         (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>)this;
}

Assistant:

unique_ptr<ArrowType> ArrowType::CreateListType(DBConfig &config, ArrowSchema &child, ArrowVariableSizeType size_type,
                                                bool view) {
	auto child_type = GetArrowLogicalType(config, child);

	unique_ptr<ArrowTypeInfo> type_info;
	auto type = LogicalType::LIST(child_type->GetDuckType());
	if (view) {
		type_info = ArrowListInfo::ListView(std::move(child_type), size_type);
	} else {
		type_info = ArrowListInfo::List(std::move(child_type), size_type);
	}
	return make_uniq<ArrowType>(type, std::move(type_info));
}